

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::GenerateHelperToArrayPopFastPath
          (Lowerer *this,Instr *instr,LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper)

{
  bool bVar1;
  Opnd *opndArg;
  Instr *pIVar2;
  JnHelperMethod helperMethod;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrayValueType;
  
  opndArg = IR::Instr::UnlinkSrc1(instr);
  local_32[0] = (opndArg->m_valueType).field_0;
  bVar1 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
  if ((bVar1) && (instr->m_dst == (Opnd *)0x0)) {
    helperMethod = HelperArray_NativePopWithNoDst;
  }
  else {
    bVar1 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0);
    helperMethod = HelperArray_NativeIntPop;
    if (!bVar1) {
      bVar1 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_32[0].field_0);
      helperMethod = (uint)bVar1 + (uint)bVar1 * 2 + HelperArray_VarPop;
    }
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,opndArg);
  LoadScriptContext(this,instr);
  pIVar2 = LowererMD::ChangeToHelperCall
                     (&this->m_lowererMD,instr,helperMethod,bailOutLabelHelper,(Opnd *)0x0,
                      (PropertySymOpnd *)0x0,false);
  bVar1 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
  if (bVar1) {
    if (pIVar2->m_dst == (Opnd *)0x0) {
      InsertBranch(Br,true,doneLabel,&bailOutLabelHelper->super_Instr);
    }
    else {
      InsertMissingItemCompareBranch
                (this,pIVar2->m_dst,BrNeq_A,doneLabel,&bailOutLabelHelper->super_Instr);
    }
  }
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::GenerateHelperToArrayPopFastPath(IR::Instr * instr, IR::LabelInstr * doneLabel, IR::LabelInstr * bailOutLabelHelper)
{
    IR::Opnd * arrayHelperOpnd = instr->UnlinkSrc1();
    ValueType arrayValueType = arrayHelperOpnd->GetValueType();

    IR::JnHelperMethod helperMethod;

    //Decide the helperMethod based on dst availability and nativity of the array.
    // ToDo: Maybe ignore fast path if `JavascriptArray::HasAnyES5ArrayInPrototypeChain`. See #6582 and #6824.
    if(arrayValueType.IsLikelyNativeArray() && !instr->GetDst())
    {
        helperMethod = IR::HelperArray_NativePopWithNoDst;
    }
    else if(arrayValueType.IsLikelyNativeIntArray())
    {
        helperMethod = IR::HelperArray_NativeIntPop;
    }
    else if(arrayValueType.IsLikelyNativeFloatArray())
    {
        helperMethod = IR::HelperArray_NativeFloatPop;
    }
    else
    {
        helperMethod = IR::HelperArray_VarPop;
    }

    m_lowererMD.LoadHelperArgument(instr, arrayHelperOpnd);

    LoadScriptContext(instr);

    IR::Instr * retInstr = m_lowererMD.ChangeToHelperCall(instr, helperMethod, bailOutLabelHelper);

    //We don't need missing item check for var arrays, as there it is taken care by the helper.
    if(arrayValueType.IsLikelyNativeArray())
    {
        if(retInstr->GetDst())
        {
            //Do this check only for native arrays with Dst. For Var arrays, this is taken care in the Runtime helper itself.
            InsertMissingItemCompareBranch(retInstr->GetDst(), Js::OpCode::BrNeq_A, doneLabel, bailOutLabelHelper);
        }
        else
        {
            //We need unconditional jump to doneLabel, if there is no dst in Pop instr.
            InsertBranch(Js::OpCode::Br, true, doneLabel, bailOutLabelHelper);
        }
    }

    return retInstr;
}